

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteHash
          (WrapperFieldGenerator *this,Printer *printer)

{
  char *this_00;
  Type TVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  string_view local_30;
  char *local_20;
  char *text;
  Printer *printer_local;
  WrapperFieldGenerator *this_local;
  
  local_20 = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  text = (char *)printer;
  printer_local = (Printer *)this;
  pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
  pFVar3 = Descriptor::field(pDVar2,0);
  TVar1 = FieldDescriptor::type(pFVar3);
  if (TVar1 == TYPE_FLOAT) {
    local_20 = 
    "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n"
    ;
  }
  else {
    pDVar2 = FieldDescriptor::message_type((this->super_FieldGeneratorBase).descriptor_);
    pFVar3 = Descriptor::field(pDVar2,0);
    TVar1 = FieldDescriptor::type(pFVar3);
    if (TVar1 == TYPE_DOUBLE) {
      local_20 = 
      "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n"
      ;
    }
  }
  this_00 = text;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,local_20);
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            ((Printer *)this_00,&(this->super_FieldGeneratorBase).variables_,local_30);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.GetHashCode($property_name$);\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
  printer->Print(variables_, text);
}